

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::BuiltinPrecisionTests::
GenFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<float,float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
::getName_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)((long)this + 0x28));
  return __return_storage_ptr__;
}

Assistant:

string				getName				(void) const
	{
		return m_name;
	}